

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::generateMulti2D3DCorrespondences
               (translation_t *position,rotation_t *rotation,translations_t *camOffsets,
               rotations_t *camRotations,size_t pointsPerCam,double noise,double outlierFraction,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiPoints,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors,
               vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
               *gt)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  long *plVar4;
  iterator iVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  translations_t *ptVar8;
  element_type *peVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  rotation_t *prVar12;
  DenseStorage<double,__1,__1,__1,_0> *this;
  long lVar13;
  void *__ptr;
  pointer pMVar14;
  undefined8 *puVar15;
  pointer pMVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  SrcEvaluatorType srcEvaluator;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  double dVar26;
  ulong uVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM4 [64];
  shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> gt_sub;
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors;
  Vector3d local_158;
  double dStack_140;
  value_type local_138;
  translations_t *local_128;
  value_type local_120;
  ulong local_110;
  double local_108;
  double local_100;
  undefined1 local_f8 [16];
  rotations_t *local_e8;
  rotation_t *local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  double local_60;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  *local_58;
  size_t local_50;
  Vector3d local_48;
  
  pMVar14 = (camOffsets->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar16 = (camOffsets->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_128 = camOffsets;
  local_e8 = camRotations;
  local_e0 = rotation;
  local_d8 = noise;
  local_60 = outlierFraction;
  local_58 = multiPoints;
  if (pMVar16 != pMVar14) {
    uVar27 = 0;
    local_f8._0_8_ = pointsPerCam * 3;
    do {
      this = (DenseStorage<double,__1,__1,__1,_0> *)
             Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_new
                       ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x18,
                        (size_t)rotation);
      this->m_cols = 0;
      this->m_data = (double *)0x0;
      this->m_rows = 0;
      if ((pointsPerCam != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)pointsPerCam),0)
          < 3)) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = operator_delete;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this,local_f8._0_8_,3,pointsPerCam);
      local_138.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Eigen::Matrix<double,_1,_1,0,_1,_1>*>
                (&local_138.
                  super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(Matrix<double,__1,__1,_0,__1,__1> *)this);
      auVar29 = in_ZMM4._0_16_;
      if (pointsPerCam != 0) {
        lVar19 = 0;
        sVar25 = 0;
        do {
          in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
          generateRandomPoint(&local_158,8.0,4.0);
          auVar29 = in_ZMM4._0_16_;
          pdVar2 = *(double **)
                    &(local_138.
                      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
          uVar3 = *(Index *)((long)local_138.
                                   super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 8);
          uVar22 = uVar3;
          if ((((ulong)(pdVar2 + uVar3 * sVar25) & 7) == 0) &&
             (uVar22 = (ulong)(-((uint)((ulong)(pdVar2 + uVar3 * sVar25) >> 3) & 0x1fffffff) & 7),
             (long)uVar3 <= (long)uVar22)) {
            uVar22 = uVar3;
          }
          uVar23 = uVar3 - uVar22;
          uVar17 = uVar23 + 7;
          if (-1 < (long)uVar23) {
            uVar17 = uVar23;
          }
          if (0 < (long)uVar22) {
            uVar24 = 0;
            do {
              *(double *)((long)pdVar2 + uVar24 * 8 + uVar3 * lVar19) =
                   local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar24];
              uVar24 = uVar24 + 1;
            } while (uVar22 != uVar24);
          }
          uVar17 = (uVar17 & 0xfffffffffffffff8) + uVar22;
          if (7 < (long)uVar23) {
            do {
              dVar26 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[uVar22 + 1];
              dVar32 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[uVar22 + 2];
              dVar28 = (&dStack_140)[uVar22];
              peVar6 = (&local_138.
                         super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)[uVar22];
              p_Var7 = (&local_138.
                         super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount)[uVar22]._M_pi;
              ptVar8 = (&local_128)[uVar22];
              peVar9 = (&local_120.
                         super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)[uVar22];
              pdVar1 = (double *)((long)pdVar2 + uVar22 * 8 + uVar3 * lVar19);
              *pdVar1 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[uVar22];
              pdVar1[1] = dVar26;
              pdVar1[2] = dVar32;
              pdVar1[3] = dVar28;
              pdVar1[4] = (double)peVar6;
              pdVar1[5] = (double)p_Var7;
              pdVar1[6] = (double)ptVar8;
              pdVar1[7] = (double)peVar9;
              uVar22 = uVar22 + 8;
            } while ((long)uVar22 < (long)uVar17);
          }
          if ((long)uVar17 < (long)uVar3) {
            do {
              *(double *)((long)pdVar2 + uVar17 * 8 + uVar3 * lVar19) =
                   local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar3 != uVar17);
          }
          sVar25 = sVar25 + 1;
          lVar19 = lVar19 + 8;
        } while (sVar25 != pointsPerCam);
      }
      in_ZMM4 = ZEXT1664(auVar29);
      std::
      vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::push_back(gt,&local_138);
      if (local_138.
          super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.
                   super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      rotation = (rotation_t *)0xaaaaaaaaaaaaaaab;
      uVar27 = uVar27 + 1;
      pMVar14 = (local_128->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pMVar16 = (local_128->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar27 < (ulong)(((long)pMVar16 - (long)pMVar14 >> 3) * -0x5555555555555555));
  }
  if (pMVar16 != pMVar14) {
    local_110 = 0;
    local_50 = pointsPerCam;
    do {
      local_138.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)operator_new(0x18);
      ((DenseStorage<double,__1,__1,__1,_0> *)
      local_138.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_cols = 0;
      ((DenseStorage<double,__1,__1,__1,_0> *)
      local_138.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_data = (double *)0x0;
      ((DenseStorage<double,__1,__1,__1,_0> *)
      local_138.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_rows = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_138.
                  super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_138.
                    super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
      local_120.
      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(0x18);
      *(pointer *)
       ((long)local_120.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x10) = (pointer)0x0;
      *(undefined8 *)
       local_120.
       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = 0;
      *(pointer *)
       ((long)local_120.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 8) = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_120.
                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_120.
                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      if (pointsPerCam != 0) {
        lVar20 = 0;
        sVar25 = 0;
        pMVar16 = (local_128->
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar21 = local_110 * 0x10;
        pMVar14 = pMVar16 + local_110;
        local_78 = (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                   .m_data.array[0];
        dStack_70 = *(double *)
                     ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                             .m_storage.m_data + 8);
        lVar19 = *(long *)local_e8;
        pdVar2 = (double *)(lVar19 + 0x18 + local_110 * 0x48);
        local_a8 = *pdVar2;
        dStack_a0 = pdVar2[1];
        pdVar2 = (double *)(lVar19 + 0x30 + local_110 * 0x48);
        local_c8 = *pdVar2;
        dStack_c0 = pdVar2[1];
        local_88._0_8_ =
             *(double *)
              ((long)&pMVar16[local_110].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              + 0x10);
        pdVar2 = (double *)(lVar19 + local_110 * 0x48);
        local_98 = *pdVar2;
        dStack_90 = pdVar2[1];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(lVar19 + 0x28 + local_110 * 0x48);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar19 + 0x10 + local_110 * 0x48);
        local_b8 = vmovlhps_avx(auVar29,auVar33);
        local_108 = *(double *)(lVar19 + 0x40 + local_110 * 0x48);
        do {
          plVar4 = *(long **)(*(long *)gt + lVar21);
          lVar19 = *plVar4;
          lVar13 = plVar4[1] * sVar25;
          pdVar2 = (double *)(lVar19 + lVar13 * 8);
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = *pdVar2;
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = pdVar2[1];
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = *(double *)(lVar19 + 0x10 + lVar13 * 8);
          iVar5._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_138.
                       super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar5._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_138.
                      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_138.
                          super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar5,&local_158);
          }
          else {
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
            *(Index *)((long)local_138.
                             super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 8) =
                 *(Index *)((long)local_138.
                                  super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 8) + 0x18;
          }
          plVar4 = *(long **)(*(long *)gt + lVar21);
          lVar19 = *plVar4;
          lVar13 = plVar4[1];
          __ptr = malloc(0x58);
          if (__ptr == (void *)0x0) {
            puVar15 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar15 = operator_delete;
            __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          uVar27 = (ulong)__ptr & 0xffffffffffffffc0;
          lVar18 = 0;
          *(void **)(uVar27 + 0x38) = __ptr;
          do {
            *(double *)(uVar27 + 0x40 + lVar18 * 8) =
                 *(double *)(lVar19 + lVar13 * lVar20 + lVar18 * 8) -
                 (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          dVar32 = *(double *)(uVar27 + 0x40);
          dVar28 = *(double *)(uVar27 + 0x48);
          dVar26 = *(double *)(uVar27 + 0x50);
          auVar29 = vmovhpd_avx(*(undefined1 (*) [16])
                                 ((local_e0->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array + 2),
                                (local_e0->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]);
          auVar34._0_8_ =
               dVar32 * (local_e0->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[0] +
               dVar28 * (local_e0->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[1] + dVar26 * auVar29._0_8_;
          auVar34._8_8_ =
               dVar32 * (local_e0->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[3] +
               dVar28 * (local_e0->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[4] + dVar26 * auVar29._8_8_;
          auVar11._8_8_ = dStack_70;
          auVar11._0_8_ = local_78;
          local_f8 = vsubpd_avx(auVar34,auVar11);
          local_100 = dVar26 * (local_e0->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] +
                      dVar32 * (local_e0->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6] +
                      dVar28 * (local_e0->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7];
          free(__ptr);
          dVar26 = local_100 - (double)local_88._0_8_;
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = dVar26 * (double)local_b8._0_8_ +
                     (double)local_f8._0_8_ * local_98 + (double)local_f8._8_8_ * dStack_90;
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = dVar26 * (double)local_b8._8_8_ +
                     (double)local_f8._0_8_ * local_a8 + (double)local_f8._8_8_ * dStack_a0;
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = dVar26 * local_108 +
                     (double)local_f8._0_8_ * local_c8 + (double)local_f8._8_8_ * dStack_c0;
          iVar5._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_120.
                       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar5._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_120.
                      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_120.
                          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar5,&local_158);
          }
          else {
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
            *(long *)((long)local_120.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8) =
                 *(long *)((long)local_120.
                                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8) + 0x18;
          }
          lVar19 = *(long *)local_120.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
          auVar29 = *(undefined1 (*) [16])(lVar19 + sVar25 * 0x18);
          dVar26 = *(double *)(lVar19 + 0x10 + sVar25 * 0x18);
          auVar35._8_8_ = 0;
          auVar35._0_8_ =
               dVar26 * dVar26 + auVar29._0_8_ * auVar29._0_8_ + auVar29._8_8_ * auVar29._8_8_;
          auVar33 = vsqrtpd_avx(auVar35);
          dVar32 = auVar33._0_8_;
          auVar41._8_8_ = dVar32;
          auVar41._0_8_ = dVar32;
          auVar29 = vdivpd_avx(auVar29,auVar41);
          *(undefined1 (*) [16])(lVar19 + sVar25 * 0x18) = auVar29;
          *(double *)(lVar19 + 0x10 + sVar25 * 0x18) = dVar26 / dVar32;
          if (0.0 < local_d8) {
            pdVar2 = (double *)
                     (*(long *)local_120.
                               super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + sVar25 * 0x18);
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = *pdVar2;
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar2[1];
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = *(double *)
                        (*(long *)local_120.
                                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x10 + sVar25 * 0x18);
            addNoise(&local_158,local_d8,&local_48);
            lVar19 = *(long *)local_120.
                              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
            *(double *)(lVar19 + 0x10 + sVar25 * 0x18) =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            pdVar2 = (double *)(lVar19 + sVar25 * 0x18);
            *pdVar2 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0];
            pdVar2[1] = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[1];
          }
          sVar25 = sVar25 + 1;
          lVar20 = lVar20 + 8;
          pointsPerCam = local_50;
        } while (sVar25 != local_50);
      }
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(local_58,(value_type *)&local_138);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(multiBearingVectors,&local_120);
      if (local_120.
          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_138.
          super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.
                   super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      prVar12 = local_e0;
      pMVar14 = (local_128->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pMVar16 = (local_128->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      local_110 = local_110 + 1;
    } while (local_110 < (ulong)(((long)pMVar16 - (long)pMVar14 >> 3) * -0x5555555555555555));
    if (pMVar16 != pMVar14) {
      auVar29 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,pointsPerCam);
      local_c8 = 0.0;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = auVar29._0_8_ * local_60;
      auVar29 = vroundsd_avx(auVar30,auVar30,9);
      dVar26 = (double)vcvttsd2usi_avx512f(auVar29);
      local_108 = dVar26;
      do {
        if (dVar26 != 0.0) {
          lVar20 = 0x10;
          local_f8 = *(undefined1 (*) [16])
                      pMVar14[(long)local_c8].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array;
          local_100 = pMVar14[(long)local_c8].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[2];
          lVar19 = *(long *)local_e8;
          local_b8._0_8_ = (long)local_c8 << 4;
          pdVar2 = (double *)(lVar19 + 0x18 + (long)local_c8 * 0x48);
          local_78 = *pdVar2;
          dStack_70 = pdVar2[1];
          pdVar2 = (double *)(lVar19 + 0x30 + (long)local_c8 * 0x48);
          local_98 = *pdVar2;
          dStack_90 = pdVar2[1];
          pdVar2 = (double *)(lVar19 + (long)local_c8 * 0x48);
          local_d8 = *pdVar2;
          dStack_d0 = pdVar2[1];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(lVar19 + 0x28 + (long)local_c8 * 0x48);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(lVar19 + 0x10 + (long)local_c8 * 0x48);
          local_88 = vmovlhps_avx(auVar38,auVar42);
          local_a8 = *(double *)(lVar19 + 0x40 + (long)local_c8 * 0x48);
          do {
            generateRandomPoint(&local_158,8.0,4.0);
            auVar10._8_8_ =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
            auVar10._0_8_ =
                 local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
            auVar33 = vsubpd_avx(auVar10,*(undefined1 (*) [16])
                                          (position->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          ).m_storage.m_data.array);
            dVar32 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] -
                     (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[2];
            auVar29 = vmovhpd_avx(*(undefined1 (*) [16])
                                   ((prVar12->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                    m_storage.m_data.array + 2),
                                  (prVar12->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5]);
            dVar28 = auVar33._0_8_;
            dVar31 = auVar33._8_8_;
            lVar19 = **(long **)(*(long *)multiBearingVectors + local_b8._0_8_);
            auVar39._0_8_ =
                 dVar32 * auVar29._0_8_ +
                 dVar28 * (prVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[0] +
                 dVar31 * (prVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[1];
            auVar39._8_8_ =
                 dVar32 * auVar29._8_8_ +
                 dVar28 * (prVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[3] +
                 dVar31 * (prVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[4];
            auVar29 = vsubpd_avx(auVar39,local_f8);
            dVar37 = auVar29._0_8_;
            dVar40 = auVar29._8_8_;
            dVar32 = (dVar32 * (prVar12->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] +
                     dVar28 * (prVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              ).m_storage.m_data.array[6] +
                     dVar31 * (prVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              ).m_storage.m_data.array[7]) - local_100;
            pdVar2 = (double *)(lVar19 + -0x10 + lVar20);
            *pdVar2 = dVar32 * (double)local_88._0_8_ + dVar37 * local_d8 + dVar40 * dStack_d0;
            pdVar2[1] = dVar32 * (double)local_88._8_8_ + dVar37 * local_78 + dVar40 * dStack_70;
            *(double *)(lVar19 + lVar20) =
                 dVar32 * local_a8 + dVar37 * local_98 + dVar40 * dStack_90;
            lVar19 = **(long **)(*(long *)multiBearingVectors + local_b8._0_8_);
            auVar29 = *(undefined1 (*) [16])(lVar19 + -0x10 + lVar20);
            dVar32 = *(double *)(lVar19 + lVar20);
            auVar36._8_8_ = 0;
            auVar36._0_8_ =
                 dVar32 * dVar32 + auVar29._0_8_ * auVar29._0_8_ + auVar29._8_8_ * auVar29._8_8_;
            auVar33 = vsqrtpd_avx(auVar36);
            dVar28 = auVar33._0_8_;
            auVar43._8_8_ = dVar28;
            auVar43._0_8_ = dVar28;
            auVar29 = vdivpd_avx(auVar29,auVar43);
            *(undefined1 (*) [16])(lVar19 + -0x10 + lVar20) = auVar29;
            *(double *)(lVar19 + lVar20) = dVar32 / dVar28;
            lVar20 = lVar20 + 0x18;
            dVar26 = (double)((long)dVar26 + -1);
          } while (dVar26 != 0.0);
          pMVar14 = (local_128->
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pMVar16 = (local_128->
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          dVar26 = local_108;
        }
        local_c8 = (double)((long)local_c8 + 1);
      } while ((ulong)local_c8 < (ulong)(((long)pMVar16 - (long)pMVar14 >> 3) * -0x5555555555555555)
              );
    }
  }
  return;
}

Assistant:

void
opengv::generateMulti2D3DCorrespondences(
    const translation_t & position,
    const rotation_t & rotation,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t pointsPerCam,
    double noise,
    double outlierFraction,
    std::vector<std::shared_ptr<points_t> > & multiPoints,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors,
    std::vector<std::shared_ptr<Eigen::MatrixXd> > & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    std::shared_ptr<Eigen::MatrixXd> gt_sub(new Eigen::MatrixXd(3,pointsPerCam));
    for( size_t i = 0; i < pointsPerCam; i++ )
      gt_sub->col(i) = generateRandomPoint( maxDepth, minDepth );
    gt.push_back(gt_sub);
  }

  //iterate through the cameras (pairs)
  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    //create the bearing-vector arrays for this camera
    std::shared_ptr<points_t> points(new points_t());
    std::shared_ptr<bearingVectors_t> bearingVectors(new bearingVectors_t());

    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //now iterate through the points of that camera
    for( size_t i = 0; i < (size_t) pointsPerCam; i++ )
    {
      points->push_back(gt[cam]->col(i));

      //project the point into the viewpoint frame
      point_t bodyPoint = rotation.transpose()*(gt[cam]->col(i) - position);

      //project that point into the camera
      bearingVectors->push_back( camRotation.transpose()*(bodyPoint - camOffset) );

      //normalize the vector
      (*bearingVectors)[i] = (*bearingVectors)[i] / (*bearingVectors)[i].norm();

      //add noise
      if( noise > 0.0 )
        (*bearingVectors)[i] = addNoise(noise,(*bearingVectors)[i]);
    }

    //push back the stuff for this camera
    multiPoints.push_back(points);
    multiBearingVectors.push_back(bearingVectors);
  }

  //add outliers
  size_t outliersPerCam = (size_t) floor(outlierFraction*pointsPerCam);

  //iterate through the cameras
  for(size_t cam = 0; cam < camOffsets.size(); cam++)
  {
    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //add outliers
    for(size_t i = 0; i < outliersPerCam; i++)
    {
      //generate a random point
      point_t p = generateRandomPoint(8,4);

      //transform that point into viewpoint 2 only
      point_t bodyPoint = rotation.transpose()*(p - position);

      //use as measurement (outlier)
      (*(multiBearingVectors[cam].get()))[i] =
          camRotation.transpose()*(bodyPoint - camOffset);

      //normalize
      (*(multiBearingVectors[cam].get()))[i] =
          (*(multiBearingVectors[cam].get()))[i] / (*(multiBearingVectors[cam].get()))[i].norm();
    }
  }
}